

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

int __thiscall
kj::ArrayBuilder<kj::HashMap<int,_kj::String>::Entry>::truncate
          (ArrayBuilder<kj::HashMap<int,_kj::String>::Entry> *this,char *__file,__off_t __length)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  StringPtr *target;
  size_t size_local;
  ArrayBuilder<kj::StringPtr> *this_local;
  
  pcVar3 = (char *)size(this);
  if (__file <= pcVar3) {
    lVar1 = *(long *)this;
    while ((ulong)(lVar1 + (long)__file * 0x20) < *(ulong *)(this + 8)) {
      lVar2 = *(long *)(this + 8);
      *(StringPtr **)(this + 8) = (StringPtr *)(lVar2 + -0x20);
      dtor<kj::HashMap<int,kj::String>::Entry>((StringPtr *)(lVar2 + -0x20));
    }
    return (int)*(ulong *)(this + 8);
  }
  kj::_::inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array.h"
             ,0x1b8,"size <= this->size()","\"can\'t use truncate() to expand\"",
             "can\'t use truncate() to expand");
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }